

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::generateLog<int,int>
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *msg,int result,
          int expected)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StringStream s;
  
  StringStream::StringStream(&s);
  poVar2 = std::operator<<((ostream *)&s,(string *)msg);
  poVar2 = std::operator<<(poVar2," expected: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected);
  poVar2 = std::operator<<(poVar2," actual: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result);
  std::operator<<(poVar2,"\n");
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(this,0);
  poVar2 = std::operator<<((ostream *)&s,(string *)CONCAT44(extraout_var,iVar1));
  std::operator<<(poVar2,"\n");
  iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(this,1);
  poVar2 = std::operator<<((ostream *)&s,(string *)CONCAT44(extraout_var_00,iVar1));
  std::operator<<(poVar2,"\n");
  std::__cxx11::stringbuf::str();
  StringStream::~StringStream(&s);
  return __return_storage_ptr__;
}

Assistant:

String generateLog(const String& msg, T0 result, T1 expected)
	{
		StringStream s;
		s << msg << " expected: " << expected << " actual: " << result << "\n";
		s << getSource(VertexShader) << "\n";
		s << getSource(FragmentShader) << "\n";
		return s.str();
	}